

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

lys_type * warn_is_equal_type_next_type(lys_type *type,lys_type *prev_type)

{
  int local_24;
  lys_type *plStack_20;
  int found;
  lys_type *prev_type_local;
  lys_type *type_local;
  
  local_24 = 0;
  plStack_20 = prev_type;
  prev_type_local = type;
  type_local = type;
  if (type->base == LY_TYPE_LEAFREF) {
    if ((type->info).lref.target != (lys_node_leaf *)0x0) {
      type_local = warn_is_equal_type_next_type(&((type->info).lref.target)->type,prev_type);
    }
  }
  else if (type->base == LY_TYPE_UNION) {
    type_local = lyp_get_next_union_type(type,prev_type,&local_24);
  }
  else if (prev_type != (lys_type *)0x0) {
    if (type != prev_type) {
      __assert_fail("type == prev_type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0xb98,
                    "struct lys_type *warn_is_equal_type_next_type(struct lys_type *, struct lys_type *)"
                   );
    }
    type_local = (lys_type *)0x0;
  }
  return type_local;
}

Assistant:

static struct lys_type *
warn_is_equal_type_next_type(struct lys_type *type, struct lys_type *prev_type)
{
    int found = 0;

    switch (type->base) {
    case LY_TYPE_UNION:
        /* this can, unfortunately, return leafref */
        return lyp_get_next_union_type(type, prev_type, &found);
    case LY_TYPE_LEAFREF:
        if (!type->info.lref.target) {
            /* we are in a grouping */
            return type;
        }
        return warn_is_equal_type_next_type(&type->info.lref.target->type, prev_type);
    default:
        if (prev_type) {
            assert(type == prev_type);
            return NULL;
        } else {
            return type;
        }
    }
}